

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-opcnt.cc
# Opt level: O0

pair<const_double_*,_unsigned_long> __thiscall
wabt::OpcodeInfo::GetDataArray<double>(OpcodeInfo *this)

{
  bool bVar1;
  size_type_conflict sVar2;
  ulong local_40;
  double *local_38;
  int local_2c;
  void *local_28;
  OpcodeInfo *local_20;
  OpcodeInfo *this_local;
  
  local_20 = this;
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&this->data_);
  if (bVar1) {
    local_28 = (void *)0x0;
    local_2c = 0;
    std::pair<const_double_*,_unsigned_long>::pair<std::nullptr_t,_int,_true>
              ((pair<const_double_*,_unsigned_long> *)&this_local,&local_28,&local_2c);
  }
  else {
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data_);
    if ((sVar2 & 7) != 0) {
      __assert_fail("data_.size() % sizeof(T) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/binary-reader-opcnt.cc"
                    ,0x39,
                    "std::pair<const T *, size_t> wabt::OpcodeInfo::GetDataArray() const [T = double]"
                   );
    }
    local_38 = (double *)
               std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->data_);
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data_);
    local_40 = sVar2 >> 3;
    _this_local = std::make_pair<double_const*,unsigned_long>(&local_38,&local_40);
  }
  return _this_local;
}

Assistant:

std::pair<const T*, size_t> OpcodeInfo::GetDataArray() const {
  if (data_.empty()) {
    return std::pair<const T*, size_t>(nullptr, 0);
  }

  assert(data_.size() % sizeof(T) == 0);
  return std::make_pair(reinterpret_cast<const T*>(data_.data()),
                        data_.size() / sizeof(T));
}